

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Node * prvTidyParseRowGroup(TidyDocImpl *doc,Node *rowgroup,GetTokenMode mode)

{
  Lexer *pLVar1;
  TidyParserMemory data;
  TidyParserMemory data_00;
  Bool BVar2;
  code *pcStack_a8;
  TidyParserMemory memory_1;
  TidyParserMemory memory;
  Node *pNStack_40;
  parserState state;
  Node *parent;
  Node *node;
  Lexer *lexer;
  Node *pNStack_20;
  GetTokenMode mode_local;
  Node *rowgroup_local;
  TidyDocImpl *doc_local;
  
  pLVar1 = doc->lexer;
  memory._44_4_ = 0;
  if (rowgroup == (Node *)0x0) {
    prvTidypopMemory((TidyParserMemory *)&memory_1.register_2,doc);
    pNStack_20 = (Node *)memory.identity;
    memory._44_4_ = memory.reentry_node._4_4_;
  }
  else {
    pNStack_20 = rowgroup;
    if ((rowgroup->tag->model & 1) != 0) {
      return (Node *)0x0;
    }
  }
LAB_0014cdff:
  while( true ) {
    while( true ) {
      do {
        while( true ) {
          while( true ) {
            if (memory._44_4_ == 2) {
              return (Node *)0x0;
            }
            if (memory._44_4_ == 0) break;
            if (memory._44_4_ == 1) {
              pLVar1->exiled = no;
              memory._44_4_ = 0;
            }
          }
          parent = prvTidyGetToken(doc,IgnoreWhitespace);
          memset(&pcStack_a8,0,0x30);
          if (parent != (Node *)0x0) break;
          memory._44_4_ = 2;
        }
        if (parent->tag == pNStack_20->tag) {
          if (parent->type == EndTag) {
            pNStack_20->closed = yes;
            prvTidyFreeNode(doc,parent);
            return (Node *)0x0;
          }
          prvTidyUngetToken(doc);
          return (Node *)0x0;
        }
        if ((((parent != (Node *)0x0) && (parent->tag != (Dict *)0x0)) &&
            (parent->tag->id == TidyTag_TABLE)) && (parent->type == EndTag)) {
          prvTidyUngetToken(doc);
          return (Node *)0x0;
        }
        BVar2 = InsertMisc(pNStack_20,parent);
      } while (BVar2 != no);
      if ((parent->tag != (Dict *)0x0) || (parent->type == TextNode)) break;
      prvTidyReport(doc,pNStack_20,parent,0x235);
      prvTidyFreeNode(doc,parent);
    }
    if (parent->type == EndTag) break;
    if ((((parent != (Node *)0x0) && (parent->tag != (Dict *)0x0)) &&
        (parent->tag->id == TidyTag_TD)) ||
       (((parent != (Node *)0x0 && (parent->tag != (Dict *)0x0)) && (parent->tag->id == TidyTag_TH))
       )) {
      prvTidyUngetToken(doc);
      parent = prvTidyInferredTag(doc,TidyTag_TR);
      prvTidyReport(doc,pNStack_20,parent,0x261);
      break;
    }
    BVar2 = prvTidynodeIsText(parent);
    if ((BVar2 == no) && (BVar2 = prvTidynodeHasCM(parent,0x18), BVar2 == no)) {
      if ((parent->tag->model & 4) == 0) break;
      prvTidyReport(doc,pNStack_20,parent,0x27e);
      MoveToHead(doc,pNStack_20,parent);
    }
    else {
      MoveBeforeTable(doc,pNStack_20,parent);
      prvTidyReport(doc,pNStack_20,parent,0x27e);
      pLVar1->exiled = yes;
      if (parent->type != TextNode) {
        pcStack_a8 = prvTidyParseRowGroup;
        memory_1.identity = (Parser *)pNStack_20;
        memory_1.reentry_node._4_4_ = 1;
        data.reentry_state = 1;
        data.reentry_mode = memory_1.reentry_node._0_4_;
        data.original_node = pNStack_20;
        data.identity = prvTidyParseRowGroup;
        data.reentry_node = parent;
        data.mode = memory_1.reentry_mode;
        data.register_1 = memory_1.reentry_state;
        data.register_2 = memory_1.mode;
        data._44_4_ = memory_1.register_1;
        memory_1.original_node = parent;
        prvTidypushMemory(doc,data);
        return parent;
      }
      memory._44_4_ = 1;
    }
  }
  if (parent->type == EndTag) {
    if ((((parent != (Node *)0x0) && (parent->tag != (Dict *)0x0)) &&
        (parent->tag->id == TidyTag_FORM)) || (BVar2 = prvTidynodeHasCM(parent,0x18), BVar2 != no))
    {
      if (((parent != (Node *)0x0) && (parent->tag != (Dict *)0x0)) &&
         (parent->tag->id == TidyTag_FORM)) {
        BadForm(doc);
      }
      prvTidyReport(doc,pNStack_20,parent,0x235);
      prvTidyFreeNode(doc,parent);
      goto LAB_0014cdff;
    }
    if (((((parent != (Node *)0x0) && (parent->tag != (Dict *)0x0)) &&
         (parent->tag->id == TidyTag_TR)) ||
        (((parent != (Node *)0x0 && (parent->tag != (Dict *)0x0)) && (parent->tag->id == TidyTag_TD)
         ))) || (((parent != (Node *)0x0 && (parent->tag != (Dict *)0x0)) &&
                 (parent->tag->id == TidyTag_TH)))) {
      prvTidyReport(doc,pNStack_20,parent,0x235);
      prvTidyFreeNode(doc,parent);
      goto LAB_0014cdff;
    }
    for (pNStack_40 = pNStack_20->parent; pNStack_40 != (Node *)0x0; pNStack_40 = pNStack_40->parent
        ) {
      if (parent->tag == pNStack_40->tag) {
        prvTidyUngetToken(doc);
        return (Node *)0x0;
      }
    }
  }
  if (((parent->tag->model & 0x100) != 0) && (parent->type != EndTag)) {
    prvTidyUngetToken(doc);
    return (Node *)0x0;
  }
  if (parent->type != EndTag) {
    if (((parent == (Node *)0x0) || (parent->tag == (Dict *)0x0)) || (parent->tag->id != TidyTag_TR)
       ) {
      parent = prvTidyInferredTag(doc,TidyTag_TR);
      prvTidyReport(doc,pNStack_20,parent,0x261);
      prvTidyUngetToken(doc);
    }
    prvTidyInsertNodeAtEnd(pNStack_20,parent);
    pcStack_a8 = prvTidyParseRowGroup;
    memory_1.identity = (Parser *)pNStack_20;
    memory_1.original_node = parent;
    memory_1.reentry_node._4_4_ = 0;
    data_00.original_node = pNStack_20;
    data_00.identity = prvTidyParseRowGroup;
    data_00.reentry_node = parent;
    data_00.reentry_mode = memory_1.reentry_node._0_4_;
    data_00.reentry_state = 0;
    data_00.mode = memory_1.reentry_mode;
    data_00.register_1 = memory_1.reentry_state;
    data_00.register_2 = memory_1.mode;
    data_00._44_4_ = memory_1.register_1;
    prvTidypushMemory(doc,data_00);
    return parent;
  }
  prvTidyReport(doc,pNStack_20,parent,0x235);
  prvTidyFreeNode(doc,parent);
  goto LAB_0014cdff;
}

Assistant:

Node* TY_(ParseRowGroup)( TidyDocImpl* doc, Node *rowgroup, GetTokenMode ARG_UNUSED(mode) )
{
    Lexer* lexer = doc->lexer;
    Node *node = NULL;
    Node *parent = NULL;
    DEBUG_LOG_COUNTERS;

    enum parserState {
        STATE_INITIAL,                /* This is the initial state for every parser. */
        STATE_POST_NOT_TEXTNODE,      /* To-do after re-entering after checks. */
        STATE_COMPLETE,               /* Done with the switch. */
    } state = STATE_INITIAL;

    if ( rowgroup == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        rowgroup = memory.original_node;
        state = memory.reentry_state;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(rowgroup);
        if (rowgroup->tag->model & CM_EMPTY)
        {
            DEBUG_LOG_EXIT;
            return NULL;
        }
    }

    while ( state != STATE_COMPLETE )
    {
        if ( state == STATE_INITIAL )
            node = TY_(GetToken)(doc, IgnoreWhitespace);
        
        switch (state)
        {
            case STATE_INITIAL:
            {
                TidyParserMemory memory = {0};

                if (node == NULL)
                {
                    state = STATE_COMPLETE;
                    continue;
                }
                
                if (node->tag == rowgroup->tag)
                {
                    if (node->type == EndTag)
                    {
                        rowgroup->closed = yes;
                        TY_(FreeNode)( doc, node);
                        DEBUG_LOG_EXIT;
                        return NULL;
                    }

                    TY_(UngetToken)( doc );
                    DEBUG_LOG_EXIT;
                    return NULL;
                }

                /* if </table> infer end tag */
                if ( nodeIsTABLE(node) && node->type == EndTag )
                {
                    TY_(UngetToken)( doc );
                    DEBUG_LOG_EXIT;
                    return NULL;
                }

                /* deal with comments etc. */
                if (InsertMisc(rowgroup, node))
                    continue;

                /* discard unknown tags */
                if (node->tag == NULL && node->type != TextNode)
                {
                    TY_(Report)(doc, rowgroup, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                /*
                  if TD or TH then infer <TR>
                  if text or inline or block move before table
                  if head content move to head
                */

                if (node->type != EndTag)
                {
                    if ( nodeIsTD(node) || nodeIsTH(node) )
                    {
                        TY_(UngetToken)( doc );
                        node = TY_(InferredTag)(doc, TidyTag_TR);
                        TY_(Report)(doc, rowgroup, node, MISSING_STARTTAG);
                    }
                    else if ( TY_(nodeIsText)(node)
                              || TY_(nodeHasCM)(node, CM_BLOCK|CM_INLINE) )
                    {
                        MoveBeforeTable( doc, rowgroup, node );
                        TY_(Report)(doc, rowgroup, node, TAG_NOT_ALLOWED_IN);
                        lexer->exiled = yes;

                        if (node->type != TextNode)
                        {
                            memory.identity = TY_(ParseRowGroup);
                            memory.original_node = rowgroup;
                            memory.reentry_node = node;
                            memory.reentry_state = STATE_POST_NOT_TEXTNODE;
                            TY_(pushMemory)( doc, memory );
                            DEBUG_LOG_EXIT_WITH_NODE(node);
                            return node;
                        }
                        
                        state = STATE_POST_NOT_TEXTNODE;
                        continue;
                    }
                    else if (node->tag->model & CM_HEAD)
                    {
                        TY_(Report)(doc, rowgroup, node, TAG_NOT_ALLOWED_IN);
                        MoveToHead(doc, rowgroup, node);
                        continue;
                    }
                }

                /*
                  if this is the end tag for ancestor element
                  then infer end tag for this element
                */
                if (node->type == EndTag)
                {
                    if ( nodeIsFORM(node) || TY_(nodeHasCM)(node, CM_BLOCK|CM_INLINE) )
                    {
                        if ( nodeIsFORM(node) )
                            BadForm( doc );

                        TY_(Report)(doc, rowgroup, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);
                        continue;
                    }

                    if ( nodeIsTR(node) || nodeIsTD(node) || nodeIsTH(node) )
                    {
                        TY_(Report)(doc, rowgroup, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);
                        continue;
                    }

                    for ( parent = rowgroup->parent;
                          parent != NULL;
                          parent = parent->parent )
                    {
                        if (node->tag == parent->tag)
                        {
                            TY_(UngetToken)( doc );
                            DEBUG_LOG_EXIT;
                            return NULL;
                        }
                    }
                }

                /*
                  if THEAD, TFOOT or TBODY then implied end tag

                */
                if (node->tag->model & CM_ROWGRP)
                {
                    if (node->type != EndTag)
                    {
                        TY_(UngetToken)( doc );
                        DEBUG_LOG_EXIT;
                        return NULL;
                    }
                }

                if (node->type == EndTag)
                {
                    TY_(Report)(doc, rowgroup, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                if ( !nodeIsTR(node) )
                {
                    node = TY_(InferredTag)(doc, TidyTag_TR);
                    TY_(Report)(doc, rowgroup, node, MISSING_STARTTAG);
                    TY_(UngetToken)( doc );
                }

               /* node should be <TR> */
                TY_(InsertNodeAtEnd)(rowgroup, node);
                memory.identity = TY_(ParseRowGroup);
                memory.original_node = rowgroup;
                memory.reentry_node = node;
                memory.reentry_state = STATE_INITIAL;
                TY_(pushMemory)( doc, memory );
                DEBUG_LOG_EXIT_WITH_NODE(node);
                return node;
            } break;
                
                
            case STATE_POST_NOT_TEXTNODE:
            {
                lexer->exiled = no;
                state = STATE_INITIAL;
                continue;
            } break;

                
            default:
                break;
        } /* switch */
    } /* while */
    DEBUG_LOG_EXIT;
    return NULL;
}